

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentPlanner.cpp
# Opt level: O2

vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> * __thiscall
multi_agent_planning::MultiAgentPlanner::solve_best_alternative_grouping
          (vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
           *__return_storage_ptr__,MultiAgentPlanner *this,
          vector<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
          *agents,vector<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                  *instances,Scenario *scenario,int theta)

{
  int *piVar1;
  pointer pvVar2;
  int iVar3;
  ostream *poVar4;
  pointer piVar5;
  char *this_00;
  ulong uVar6;
  Plan *this_01;
  int iVar7;
  ulong uVar8;
  pointer pvVar9;
  int *piVar10;
  bool bVar11;
  long lVar12;
  int local_15c;
  vector<int,_std::allocator<int>_> alternativeCosts;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> alternativePlans;
  vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_> group_plans;
  vector<int,_std::allocator<int>_> costs;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  groups;
  Plan plan;
  string local_70;
  Plan local_50;
  
  solve_baseline(__return_storage_ptr__,this,agents,instances);
  std::vector<int,_std::allocator<int>_>::vector
            (&costs,(long)(agents->
                          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(agents->
                          super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&plan);
  lVar12 = 0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(agents->
                            super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(agents->
                            super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 6); uVar8 = uVar8 + 1) {
    this_01 = &local_50;
    Plan::Plan(&local_50,
               (Plan *)((long)&(((__return_storage_ptr__->
                                 super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->actions).
                               super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                               ._M_impl + lVar12));
    iVar3 = evaluate_one_plan((MultiAgentPlanner *)this_01,__return_storage_ptr__,scenario,&local_50
                              ,(int)uVar8);
    costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = iVar3;
    std::
    _Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
    ::~_Vector_base((_Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                     *)&local_50);
    lVar12 = lVar12 + 0x20;
  }
  local_15c = 1;
  bVar11 = false;
  while ((!bVar11 && (local_15c < theta))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"!!!!!!!!!!!! Iteration ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_15c);
    this_00 = " !!!!!!!!!!!!";
    poVar4 = std::operator<<(poVar4," !!!!!!!!!!!!");
    std::endl<char,std::char_traits<char>>(poVar4);
    get_interacting_groups(&groups,(MultiAgentPlanner *)this_00,__return_storage_ptr__,scenario);
    pvVar2 = groups.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = true;
    for (pvVar9 = groups.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1)
    {
      group_plans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      group_plans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      group_plans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      piVar1 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar10 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
        std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
        push_back(&group_plans,
                  (__return_storage_ptr__->
                  super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                  )._M_impl.super__Vector_impl_data._M_start + *piVar10);
      }
      alternativePlans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      alternativePlans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      alternativePlans.
      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      piVar1 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar10 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; piVar10 != piVar1; piVar10 = piVar10 + 1) {
        iVar3 = *piVar10;
        PlanningAgent::computeInterDependentPlan
                  (&plan,(agents->
                         super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                         )._M_impl.super__Vector_impl_data._M_start + iVar3,
                   (instances->
                   super__Vector_base<multi_agent_planning::Instance,_std::allocator<multi_agent_planning::Instance>_>
                   )._M_impl.super__Vector_impl_data._M_start + iVar3,scenario,&group_plans,1.0);
        std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::
        push_back(&alternativePlans,&plan);
        PlanningAgent::planToString_abi_cxx11_
                  (&local_70,
                   (agents->
                   super__Vector_base<multi_agent_planning::PlanningAgent,_std::allocator<multi_agent_planning::PlanningAgent>_>
                   )._M_impl.super__Vector_impl_data._M_start + iVar3,&plan);
        std::operator<<((ostream *)&std::cout,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        local_70._M_dataplus._M_p._0_4_ = (int)plan.cost;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  (&alternativeCosts,(int *)&local_70);
        std::
        _Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
        ::~_Vector_base((_Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                         *)&plan);
      }
      piVar5 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      iVar3 = 0;
      for (uVar6 = 0;
          (long)(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2 != uVar6; uVar6 = uVar6 + 1) {
        iVar7 = costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[piVar5[uVar6]] -
                alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if (0 < iVar7) {
          bVar11 = false;
        }
        if (iVar3 < iVar7) {
          uVar8 = uVar6 & 0xffffffff;
          iVar3 = iVar7;
        }
      }
      iVar3 = (int)uVar8;
      if (!bVar11) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Agent ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[iVar3]);
        poVar4 = std::operator<<(poVar4," wins!");
        std::endl<char,std::char_traits<char>>(poVar4);
        piVar5 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      Plan::operator=((__return_storage_ptr__->
                      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                      )._M_impl.super__Vector_impl_data._M_start + piVar5[iVar3],
                      alternativePlans.
                      super__Vector_base<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar3);
      costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start[iVar3]] =
           alternativeCosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar3];
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&alternativeCosts.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
                (&alternativePlans);
      std::vector<multi_agent_planning::Plan,_std::allocator<multi_agent_planning::Plan>_>::~vector
                (&group_plans);
    }
    local_15c = local_15c + 1;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&groups);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&costs.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<Plan> MultiAgentPlanner::solve_best_alternative_grouping(std::vector<PlanningAgent>& agents, 
																											const std::vector<Instance>& instances, 
																											const Scenario& scenario,
																											const int theta) {
	
	vector<Plan> plans = solve_baseline(agents, instances);

	vector<int> costs(agents.size());
	for (int id = 0; id < agents.size(); ++id) {
		costs[id] = evaluate_one_plan(plans, scenario, plans[id], id);
	}

	int iteration_counter = 1;
	bool convergence = false;

	while ((! convergence) && (iteration_counter < theta)) {
		cout << "!!!!!!!!!!!! Iteration " << iteration_counter << " !!!!!!!!!!!!" << endl;

		vector<vector<int> > groups = get_interacting_groups(plans, scenario);
		
		convergence = true;

		for (auto& group : groups) {
			
			vector<Plan> group_plans;
			for (int id : group) {
				group_plans.push_back(plans[id]);
			}

			vector<Plan> alternativePlans;
			vector<int> alternativeCosts;

			for (int id : group) {
				Plan plan = agents[id].computeInterDependentPlan(instances[id], scenario, group_plans);

				alternativePlans.push_back(plan);

				cout << agents[id].planToString(plan);

				alternativeCosts.push_back(plan.cost);
			}

			int best_alt = 0;
			int best_diff = 0;
			
			for (int i = 0; i < group.size(); ++i) {
				int cost_diff = costs[group[i]] - alternativeCosts[i];

				if (cost_diff > 0) {
					convergence = false;
				}
				
				if (cost_diff > best_diff) {
					best_diff = cost_diff;
					best_alt = i;
				}
			}

			if (! convergence) {
				cout << "Agent " << group[best_alt] << " wins!" << endl;
			}

			plans[group[best_alt]] = alternativePlans[best_alt];
			costs[group[best_alt]] = alternativeCosts[best_alt];

		}




		iteration_counter++;

	}

	return plans;
}